

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O1

bool __thiscall
QtPrivate::QStringList_contains
          (QtPrivate *this,QStringList *that,QLatin1StringView str,CaseSensitivity cs)

{
  int iVar1;
  QString *string;
  QString *this_00;
  long lVar2;
  bool bVar3;
  QLatin1StringView other;
  
  other.m_data = (char *)str.m_size;
  bVar3 = *(long *)(this + 0x10) != 0;
  if (bVar3) {
    this_00 = *(QString **)(this + 8);
    lVar2 = *(long *)(this + 0x10) * 0x18;
    do {
      if (((QStringList *)(this_00->d).size == that) &&
         (other.m_size = (qsizetype)that,
         iVar1 = QString::compare(this_00,other,(CaseSensitivity)str.m_data), iVar1 == 0)) {
        return bVar3;
      }
      this_00 = this_00 + 1;
      lVar2 = lVar2 + -0x18;
      bVar3 = lVar2 != 0;
    } while (bVar3);
  }
  return bVar3;
}

Assistant:

const T *constEnd() const noexcept { return data() + size; }